

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O2

bool __thiscall ON_Leader::Write(ON_Leader *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    bVar1 = ON_Annotation::Internal_WriteAnnotation(&this->super_ON_Annotation,archive);
    if (bVar1) {
      bVar2 = ON_BinaryArchive::WriteArray
                        (archive,&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
    }
    else {
      bVar2 = false;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Leader::Write(ON_BinaryArchive& archive) const
{
  const int chunk_version = 1;
  if (!archive.BeginWrite3dmAnonymousChunk(chunk_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (false == ON_Annotation::Internal_WriteAnnotation(archive))
      break;

    if (!archive.WriteArray(m_points))
      break;

    rc = true;
    break;
  }

  if (!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}